

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_evaluate_nurbs.cpp
# Opt level: O2

bool ON_EvaluateNurbsNonRationalSpan
               (int dim,int order,double *knot,int cv_stride,double *cv,int der_count,double t,
               int v_stride,double *v)

{
  double dVar1;
  uint uVar2;
  undefined1 extraout_AL;
  double *memblock;
  double *pdVar3;
  int iVar4;
  double *N;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  bool bVar10;
  double stack_buffer [64];
  double local_238 [65];
  
  if ((uint)(order * order) < 0x41) {
    memblock = (double *)0x0;
    N = local_238;
  }
  else {
    memblock = (double *)onmalloc((ulong)(uint)(order * order) << 3);
    N = memblock;
  }
  iVar4 = der_count + 1;
  if (cv_stride - dim < 1) {
    memset(v,0,(long)(iVar4 * v_stride) << 3);
  }
  else {
    iVar9 = iVar4;
    while (bVar10 = iVar9 != 0, iVar9 = iVar9 + -1, bVar10) {
      memset(v,0,(long)dim * 8);
      v = v + v_stride;
    }
    v = v + -(long)(iVar4 * v_stride);
  }
  iVar4 = order + -1;
  if (der_count < order) {
    iVar4 = der_count;
  }
  ON_EvaluateNurbsBasis(order,knot,t,N);
  if (iVar4 != 0) {
    ON_EvaluateNurbsBasisDerivatives(order,knot,iVar4,N);
  }
  pdVar3 = (double *)-(long)(cv_stride * order);
  iVar9 = 0;
  uVar2 = dim;
  if (dim < 1) {
    uVar2 = 0;
  }
  uVar5 = 0;
  if (0 < order) {
    uVar5 = (ulong)(uint)order;
  }
  for (; iVar9 <= iVar4; iVar9 = iVar9 + 1) {
    for (uVar6 = 0; uVar6 != uVar5; uVar6 = uVar6 + 1) {
      dVar1 = N[uVar6];
      lVar7 = (long)dim << 3;
      for (lVar8 = 0; uVar2 != (uint)lVar8; lVar8 = lVar8 + 1) {
        v[lVar8] = cv[lVar8] * dVar1 + v[lVar8];
        lVar7 = lVar7 + -8;
      }
      v = (double *)((long)v - lVar7);
      cv = (double *)((long)cv + ((long)cv_stride * 8 - lVar7));
    }
    cv = cv + -(long)(cv_stride * order);
    v = v + v_stride;
    N = N + order;
  }
  if (order == 2) {
    pdVar3 = cv + cv_stride;
    for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
      dVar1 = cv[uVar5];
      if ((dVar1 == pdVar3[uVar5]) && (!NAN(dVar1) && !NAN(pdVar3[uVar5]))) {
        v[uVar5 - (long)((iVar4 + 1) * v_stride)] = dVar1;
      }
    }
  }
  if (memblock != (double *)0x0) {
    onfree(memblock);
    return (bool)extraout_AL;
  }
  return SUB81(pdVar3,0);
}

Assistant:

static
bool ON_EvaluateNurbsNonRationalSpan( 
                  int dim,             // dimension
                  int order,           // order
                  const double* knot,  // knot[] array of (2*order-2) doubles
                  int cv_stride,       // cv_stride >= (is_rat)?dim+1:dim
                  const double* cv,    // cv[order*cv_stride] array
                  int der_count,       // number of derivatives to compute
                  double t,            // evaluation parameter
                  int v_stride,        // v_stride (>=dimension)
                  double* v            // v[(der_count+1)*v_stride] array
                  )
{
  const int stride_minus_dim = cv_stride - dim;
  const int cv_len = cv_stride*order;
  int i, j, k;
  double *N;
	double a;

  double stack_buffer[64];
  void* heap_buffer = 0;
  const size_t sizeof_buffer = (order*order)*sizeof(*N);

	N = (sizeof_buffer <= sizeof(stack_buffer)) ? stack_buffer : (double*)(heap_buffer=onmalloc(sizeof_buffer));

  if ( stride_minus_dim > 0)
  {
    i = (der_count+1);
    while( i--)
    {
      memset(v,0,dim*sizeof(v[0]));
      v += v_stride;
    }
    v -= ((der_count+1)*v_stride);
  }
  else
  {
    memset( v, 0, (der_count+1)*v_stride*sizeof(*v) );
  }

  if ( der_count >= order )
    der_count = order-1;

	// evaluate basis functions
	ON_EvaluateNurbsBasis( order, knot, t, N );
	if ( der_count ) 
		ON_EvaluateNurbsBasisDerivatives( order, knot, der_count, N );

	// convert cv's into answers
	for (i = 0; i <= der_count; i++, v += v_stride, N += order) {
    for ( j = 0; j < order; j++ ) {
      a = N[j];
      for ( k = 0; k < dim; k++ ) {
        *v++ += a* *cv++;
      }
      v -= dim;
      cv += stride_minus_dim;
    }
    cv -= cv_len;
	}

  if ( 2 == order )
  {
    // 7 January 2004  Dale Lear
    //    Added to fix those cases when, numerically, t*a + (1.0-t)*a != a.
    //    Similar to fix for RR 9683.
    v -= (der_count+1)*v_stride;
    j = cv_stride;
    for ( i = 0; i < dim; i++, j++ )
    {
      if (cv[i] == cv[j] )
        v[i] = cv[i];
    }
  }

  if ( 0 != heap_buffer )
    onfree(heap_buffer);
		
	return true;
}